

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

bool ClipperLib::PolySort(OutRec *or1,OutRec *or2)

{
  bool *pbVar1;
  bool bVar2;
  OutPt *pOVar3;
  OutPt *pOVar4;
  
  if (or1 == or2) {
    return false;
  }
  pOVar3 = or1->pts;
  pOVar4 = or2->pts;
  if (pOVar3 != (OutPt *)0x0) {
    if (pOVar4 != (OutPt *)0x0) {
      bVar2 = or1->isHole;
      if (bVar2 == true) {
        or1 = or1->FirstLeft;
      }
      pbVar1 = &or2->isHole;
      if (*pbVar1 == true) {
        or2 = or2->FirstLeft;
      }
      if ((bVar2 != *pbVar1) && (or1->idx == or2->idx)) {
        return (bool)(bVar2 ^ 1);
      }
      return or1->idx < or2->idx;
    }
    pOVar4 = (OutPt *)0x0;
  }
  return pOVar3 != (OutPt *)0x0 && pOVar3 != pOVar4;
}

Assistant:

bool PolySort(OutRec *or1, OutRec *or2)
{
  if (or1 == or2) return false;
  if (!or1->pts || !or2->pts)
  {
    if (or1->pts != or2->pts)
    {
      return or1->pts ? true : false;
    }
    else return false;
  }
  int i1, i2;
  if (or1->isHole)
    i1 = or1->FirstLeft->idx; else
    i1 = or1->idx;
  if (or2->isHole)
    i2 = or2->FirstLeft->idx; else
    i2 = or2->idx;
  int result = i1 - i2;
  if (result == 0 && (or1->isHole != or2->isHole))
  {
    return or1->isHole ? false : true;
  }
  else return result < 0;
}